

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O3

void plutovg_blend(plutovg_canvas_t *canvas,plutovg_span_buffer_t *span_buffer)

{
  float *pfVar1;
  plutovg_state_t *ppVar2;
  plutovg_paint_t pVar3;
  composition_function_t p_Var4;
  plutovg_surface_t *ppVar5;
  bool bVar6;
  _Bool _Var7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  plutovg_paint_t *ppVar21;
  uint uVar22;
  int iVar23;
  plutovg_color_t *color;
  plutovg_span_t *ppVar24;
  uint32_t uVar25;
  ulong uVar26;
  ulong in_R10;
  int iVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  undefined4 *puVar31;
  uint32_t *puVar32;
  bool bVar33;
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [12];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  composition_function_t func;
  uint32_t buffer_1 [1024];
  uint buffer [1024];
  plutovg_span_t *local_2158;
  undefined8 local_2138;
  float local_2128;
  undefined1 local_2078 [12];
  float fStack_206c;
  plutovg_paint_t local_2068;
  plutovg_paint_type_t local_2060;
  uint local_205c [1024];
  float local_105c;
  float local_1058;
  float local_1054;
  float local_1050;
  float local_104c;
  float local_1048;
  undefined1 local_1038 [12];
  float fStack_102c;
  plutovg_paint_t local_1028;
  long local_1020;
  undefined8 local_1018;
  int local_1010;
  int local_100c;
  
  if ((span_buffer->spans).size != 0) {
    ppVar2 = canvas->state;
    ppVar21 = ppVar2->paint;
    if (ppVar21 == (plutovg_paint_t *)0x0) {
      color = &ppVar2->color;
LAB_0013ebbd:
      plutovg_blend_color(canvas,color,span_buffer);
      return;
    }
    if (ppVar21->type == PLUTOVG_PAINT_TYPE_GRADIENT) {
      if (ppVar21[6].ref_count != 0) {
        local_2060 = ppVar21[1].type;
        local_2078._0_8_ = ppVar21[2];
        unique0x10001843 = ppVar21[3];
        local_2068 = ppVar21[4];
        plutovg_matrix_multiply
                  ((plutovg_matrix_t *)local_2078,(plutovg_matrix_t *)local_2078,&ppVar2->matrix);
        _Var7 = plutovg_matrix_invert((plutovg_matrix_t *)local_2078,(plutovg_matrix_t *)local_2078)
        ;
        if (_Var7) {
          iVar30 = ppVar21[6].ref_count;
          lVar15 = (long)iVar30;
          fVar38 = ppVar2->opacity;
          pVar3 = ppVar21[5];
          uVar26 = lroundf(*(float *)((long)pVar3 + 0x10) * fVar38 * 255.0);
          fVar36 = (float)(uVar26 & 0xffffffff);
          lVar11 = lroundf(*(float *)((long)pVar3 + 4) * fVar36);
          lVar12 = lroundf(*(float *)((long)pVar3 + 8) * fVar36);
          lVar13 = lroundf(fVar36 * *(float *)((long)pVar3 + 0xc));
          local_205c[0] =
               (int)lVar12 << 8 | (uint)lVar13 | (int)lVar11 << 0x10 | (int)uVar26 << 0x18;
          fVar36 = *(float *)pVar3;
          fVar34 = 0.0014648438;
          uVar26 = 1;
          if (0.0014648438 <= fVar36) {
            fVar34 = 0.0014648438;
            lVar11 = 8;
            do {
              *(uint *)((long)&((plutovg_paint_t *)local_2078)->ref_count + lVar11 * 4) =
                   local_205c[0];
              fVar34 = fVar34 + 0.0009765625;
              lVar11 = lVar11 + 1;
            } while (fVar34 <= fVar36);
            uVar26 = (ulong)((int)lVar11 - 7);
          }
          iVar23 = (int)uVar26;
          if (1 < iVar30) {
            uVar28 = 0;
            uVar8 = local_205c[0];
            do {
              fVar36 = *(float *)((long)pVar3 + uVar28 * 0x14);
              fVar40 = *(float *)((long)pVar3 + (uVar28 * 5 + 5) * 4);
              if ((fVar36 != fVar40) || (uVar22 = uVar8, NAN(fVar36) || NAN(fVar40))) {
                pfVar1 = (float *)((long)pVar3 + uVar28 * 0x14);
                uVar14 = lroundf(pfVar1[9] * fVar38 * 255.0);
                fVar37 = (float)(uVar14 & 0xffffffff);
                lVar11 = lroundf(pfVar1[6] * fVar37);
                lVar12 = lroundf(pfVar1[7] * fVar37);
                lVar13 = lroundf(fVar37 * pfVar1[8]);
                uVar22 = (int)lVar12 << 8 | (uint)lVar13 | (int)lVar11 << 0x10 | (int)uVar14 << 0x18
                ;
                fVar37 = pfVar1[5];
                if ((fVar34 < fVar37) && ((int)uVar26 < 0x400)) {
                  fVar45 = *pfVar1;
                  uVar14 = (long)(int)uVar26;
                  do {
                    iVar23 = (int)(long)((fVar34 - fVar45) * (1.0 / (fVar40 - fVar36)) * 255.0);
                    uVar10 = (uVar22 & 0xff00ff) * iVar23 + (0xff - iVar23) * (uVar8 & 0xff00ff);
                    uVar9 = iVar23 * (uVar22 >> 8 & 0xff00ff) +
                            (0xff - iVar23) * (uVar8 >> 8 & 0xff00ff);
                    local_205c[uVar14] =
                         uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) & 0xff00ff00 |
                         uVar10 + 0x800080 + (uVar10 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
                    uVar26 = uVar14 + 1;
                    fVar34 = fVar34 + 0.0009765625;
                    if (0x3fe < (long)uVar14) break;
                    uVar14 = uVar26;
                  } while (fVar34 < fVar37);
                }
              }
              uVar8 = uVar22;
              iVar23 = (int)uVar26;
              uVar28 = uVar28 + 1;
            } while (uVar28 != iVar30 - 1);
          }
          uVar26 = lroundf(fVar38 * *(float *)((long)pVar3 + (lVar15 * 5 + -1) * 4) * 255.0);
          fVar38 = (float)(uVar26 & 0xffffffff);
          lVar11 = lroundf(*(float *)((long)pVar3 + (lVar15 * 5 + -4) * 4) * fVar38);
          lVar12 = lroundf(*(float *)((long)pVar3 + (lVar15 * 5 + -3) * 4) * fVar38);
          lVar15 = lroundf(fVar38 * *(float *)((long)pVar3 + (lVar15 * 5 + -2) * 4));
          if (iVar23 < 0x400) {
            lVar13 = (long)iVar23;
            do {
              local_205c[lVar13] =
                   (int)lVar12 << 8 | (uint)lVar15 | (int)lVar11 << 0x10 | (int)uVar26 << 0x18;
              lVar13 = lVar13 + 1;
            } while ((int)lVar13 != 0x400);
          }
          local_105c = (float)ppVar21[6].type;
          local_1058 = (float)ppVar21[7].ref_count;
          local_1054 = (float)ppVar21[7].type;
          local_1050 = (float)ppVar21[8].ref_count;
          if (ppVar21[1].ref_count == 0) {
            fVar38 = local_1054 - local_105c;
            fVar36 = local_1050 - local_1058;
            auVar43._0_8_ = CONCAT44(fVar36,fVar38);
            auVar43._8_8_ = 0;
            fVar38 = fVar38 * fVar38 + fVar36 * fVar36;
            if ((fVar38 != 0.0) || (NAN(fVar38))) {
              auVar35._4_4_ = fVar38;
              auVar35._0_4_ = fVar38;
              auVar35._8_4_ = fVar38;
              auVar35._12_4_ = fVar38;
              auVar43 = divps(auVar43,auVar35);
              local_2138 = auVar43._0_8_;
              local_2128 = -auVar43._0_4_ * local_105c - local_1058 * auVar43._4_4_;
            }
            else {
              local_2128 = 0.0;
              local_2138 = auVar43._0_8_;
            }
            iVar30 = (span_buffer->spans).size;
            if (iVar30 != 0) {
              ppVar5 = canvas->surface;
              p_Var4 = composition_table[ppVar2->op];
              ppVar24 = (span_buffer->spans).data;
              do {
                iVar23 = ppVar24->len;
                if (iVar23 != 0) {
                  iVar16 = ppVar24->x;
                  do {
                    iVar27 = 0x400;
                    if (iVar23 < 0x400) {
                      iVar27 = iVar23;
                    }
                    fVar36 = 0.0;
                    auVar42 = ZEXT816(0);
                    if ((fVar38 != 0.0) || (NAN(fVar38))) {
                      fVar36 = (float)ppVar24->y + 0.5;
                      auVar42 = ZEXT416((uint)((((float)local_2078._8_4_ * fVar36 +
                                                 ((float)iVar16 + 0.5) * (float)local_2078._0_4_ +
                                                (float)local_2068.ref_count) * (float)local_2138 +
                                                (fVar36 * fStack_206c +
                                                 ((float)iVar16 + 0.5) * (float)local_2078._4_4_ +
                                                (float)local_2068.type) * local_2138._4_4_ +
                                               local_2128) * 1023.0));
                      fVar36 = ((float)local_2078._0_4_ * (float)local_2138 +
                               (float)local_2078._4_4_ * local_2138._4_4_) * 1023.0;
                    }
                    fVar34 = auVar42._0_4_;
                    if (1e-05 <= ABS(fVar36)) {
                      puVar31 = (undefined4 *)
                                ((long)&((plutovg_paint_t *)local_1038)->ref_count +
                                (long)iVar27 * 4);
                      fVar40 = (float)iVar27 * fVar36 + fVar34;
                      if ((4194303.0 <= fVar40) || (fVar40 <= -4194304.0)) {
                        if (0 < iVar23) {
                          ppVar21 = (plutovg_paint_t *)local_1038;
                          do {
                            auVar44 = auVar42._4_12_;
                            uVar8 = (uint)(auVar42._0_4_ * 0.0009765625 * 1023.0 + 0.5);
                            if (local_2060 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                              uVar8 = uVar8 & 0x7ff;
                              if (0x3ff < uVar8) {
                                uVar8 = uVar8 ^ 0x7ff;
                              }
                            }
                            else if (local_2060 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                              uVar8 = uVar8 & 0x3ff;
                            }
                            else if ((int)uVar8 < 0) {
                              uVar8 = 0;
                            }
                            else if (0x3fe < uVar8) {
                              uVar8 = 0x3ff;
                            }
                            ppVar21->ref_count = local_205c[uVar8];
                            auVar42._0_4_ = auVar42._0_4_ + fVar36;
                            auVar42._4_12_ = auVar44;
                            ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                          } while (ppVar21 < puVar31);
                        }
                      }
                      else if (0 < iVar23) {
                        iVar17 = (int)(fVar34 * 256.0) + 0x80;
                        ppVar21 = (plutovg_paint_t *)local_1038;
                        do {
                          uVar8 = iVar17 >> 8;
                          if (local_2060 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                            uVar8 = uVar8 & 0x7ff;
                            if (0x3ff < uVar8) {
                              uVar8 = uVar8 ^ 0x7ff;
                            }
                          }
                          else if (local_2060 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                            uVar8 = uVar8 & 0x3ff;
                          }
                          else if ((int)uVar8 < 0) {
                            uVar8 = 0;
                          }
                          else if (0x3fe < uVar8) {
                            uVar8 = 0x3ff;
                          }
                          ppVar21->ref_count = local_205c[uVar8];
                          ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                          iVar17 = iVar17 + (int)(fVar36 * 256.0);
                        } while (ppVar21 < puVar31);
                      }
                    }
                    else {
                      uVar8 = (int)(fVar34 * 256.0) + 0x80 >> 8;
                      if (local_2060 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                        uVar8 = uVar8 & 0x7ff;
                        if (0x3ff < uVar8) {
                          uVar8 = uVar8 ^ 0x7ff;
                        }
                      }
                      else if (local_2060 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                        uVar8 = uVar8 & 0x3ff;
                      }
                      else if ((int)uVar8 < 0) {
                        uVar8 = 0;
                      }
                      else if (0x3fe < uVar8) {
                        uVar8 = 0x3ff;
                      }
                      plutovg_memfill32((uint *)local_1038,iVar27,local_205c[uVar8]);
                    }
                    (*p_Var4)((uint32_t *)
                              (ppVar5->data +
                              (long)iVar16 * 4 + (long)ppVar5->stride * (long)ppVar24->y),iVar27,
                              (uint32_t *)local_1038,(uint32_t)ppVar24->coverage);
                    iVar16 = iVar16 + iVar27;
                    iVar23 = iVar23 - iVar27;
                  } while (iVar23 != 0);
                }
                iVar30 = iVar30 + -1;
                ppVar24 = ppVar24 + 1;
              } while (iVar30 != 0);
            }
          }
          else {
            local_104c = (float)ppVar21[8].type;
            local_1048 = (float)ppVar21[9].ref_count;
            iVar30 = (span_buffer->spans).size;
            if (iVar30 != 0) {
              ppVar5 = canvas->surface;
              ppVar24 = (span_buffer->spans).data;
              p_Var4 = composition_table[ppVar2->op];
              fVar48 = local_105c - local_1050;
              fVar50 = local_1058 - local_104c;
              fVar37 = local_1054 - local_1048;
              fVar36 = local_1048 * local_1048;
              fVar45 = (fVar37 * fVar37 - fVar48 * fVar48) - fVar50 * fVar50;
              bVar6 = local_1048 == 0.0;
              fVar34 = 1.0 / (fVar45 + fVar45);
              fVar40 = fVar34 * fVar34;
              fVar38 = fVar45 * 4.0;
              do {
                iVar23 = ppVar24->len;
                if (iVar23 != 0) {
                  iVar16 = ppVar24->x;
                  do {
                    iVar27 = 0x400;
                    if (iVar23 < 0x400) {
                      iVar27 = iVar23;
                    }
                    if ((fVar45 != 0.0) || (NAN(fVar45))) {
                      fVar46 = (float)ppVar24->y + 0.5;
                      fVar39 = ((float)local_2078._0_4_ * ((float)iVar16 + 0.5) +
                               (float)local_2078._8_4_ * fVar46 + (float)local_2068.ref_count) -
                               local_1050;
                      fVar52 = (((float)iVar16 + 0.5) * (float)local_2078._4_4_ +
                               fVar46 * fStack_206c + (float)local_2068.type) - local_104c;
                      fVar49 = fVar52 * fVar50 + local_1048 * fVar37 + fVar48 * fVar39;
                      fVar49 = fVar49 + fVar49;
                      fVar47 = (float)local_2078._0_4_ * fVar48 + fVar50 * (float)local_2078._4_4_;
                      fVar47 = fVar47 + fVar47;
                      fVar46 = (float)local_2078._0_4_ * (float)local_2078._0_4_ +
                               (float)local_2078._4_4_ * (float)local_2078._4_4_;
                      fVar53 = fVar52 * (float)local_2078._4_4_ + fVar39 * (float)local_2078._0_4_;
                      fVar51 = fVar34 * fVar49;
                      fVar39 = ((fVar36 - (fVar39 * fVar39 + fVar52 * fVar52)) * -fVar38 +
                               fVar49 * fVar49) * fVar40;
                      fVar49 = ((fVar53 + fVar53 + fVar46) * fVar38 +
                               fVar47 * fVar47 + (fVar49 + fVar49) * fVar47) * fVar40;
                      fVar46 = ((fVar46 + fVar46) * fVar38 + (fVar47 + fVar47) * fVar47) * fVar40;
                      puVar31 = (undefined4 *)
                                ((long)&((plutovg_paint_t *)local_1038)->ref_count +
                                (long)iVar27 * 4);
                      if (0.0 < fVar45 && bVar6) {
                        if (0 < iVar23) {
                          ppVar21 = (plutovg_paint_t *)local_1038;
                          do {
                            if (fVar39 < 0.0) {
                              fVar52 = sqrtf(fVar39);
                            }
                            else {
                              fVar52 = SQRT(fVar39);
                            }
                            uVar8 = (uint)((fVar52 - fVar51) * 1023.0 + 0.5);
                            if (local_2060 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                              uVar8 = uVar8 & 0x7ff;
                              uVar22 = uVar8 ^ 0x7ff;
                              bVar33 = uVar8 < 0x400;
LAB_0013f533:
                              if (!bVar33) {
                                uVar8 = uVar22;
                              }
                            }
                            else if (local_2060 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                              uVar8 = uVar8 & 0x3ff;
                            }
                            else {
                              if (-1 < (int)uVar8) {
                                uVar22 = 0x3ff;
                                bVar33 = uVar8 < 0x3ff;
                                goto LAB_0013f533;
                              }
                              uVar8 = 0;
                            }
                            ppVar21->ref_count = local_205c[uVar8];
                            ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                            fVar39 = fVar39 + fVar49;
                            fVar49 = fVar49 + fVar46;
                            fVar51 = fVar51 + fVar34 * fVar47;
                          } while (ppVar21 < puVar31);
                        }
                      }
                      else if (0 < iVar23) {
                        ppVar21 = (plutovg_paint_t *)local_1038;
                        do {
                          uVar8 = 0;
                          if (fVar39 >= 0.0) {
                            if (fVar39 < 0.0) {
                              fVar52 = sqrtf(fVar39);
                            }
                            else {
                              fVar52 = SQRT(fVar39);
                            }
                            if (0.0 <= fVar37 * (fVar52 - fVar51) + local_1048) {
                              uVar8 = (uint)((fVar52 - fVar51) * 1023.0 + 0.5);
                              if (local_2060 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                                uVar8 = uVar8 & 0x7ff;
                                uVar22 = uVar8 ^ 0x7ff;
                                bVar33 = uVar8 < 0x400;
LAB_0013f453:
                                if (!bVar33) {
                                  uVar8 = uVar22;
                                }
                              }
                              else if (local_2060 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                                uVar8 = uVar8 & 0x3ff;
                              }
                              else {
                                if (-1 < (int)uVar8) {
                                  uVar22 = 0x3ff;
                                  bVar33 = uVar8 < 0x3ff;
                                  goto LAB_0013f453;
                                }
                                uVar8 = 0;
                              }
                              uVar8 = local_205c[uVar8];
                            }
                          }
                          ppVar21->ref_count = uVar8;
                          fVar39 = fVar39 + fVar49;
                          fVar49 = fVar49 + fVar46;
                          fVar51 = fVar51 + fVar34 * fVar47;
                          ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                        } while (ppVar21 < puVar31);
                      }
                    }
                    else {
                      plutovg_memfill32((uint *)local_1038,iVar27,0);
                    }
                    (*p_Var4)((uint32_t *)
                              (ppVar5->data +
                              (long)iVar16 * 4 + (long)ppVar5->stride * (long)ppVar24->y),iVar27,
                              (uint32_t *)local_1038,(uint32_t)ppVar24->coverage);
                    iVar16 = iVar16 + iVar27;
                    iVar23 = iVar23 - iVar27;
                  } while (iVar23 != 0);
                }
                iVar30 = iVar30 + -1;
                ppVar24 = ppVar24 + 1;
              } while (iVar30 != 0);
            }
          }
        }
      }
    }
    else {
      if (ppVar21->type == PLUTOVG_PAINT_TYPE_COLOR) {
        color = (plutovg_color_t *)(ppVar21 + 1);
        goto LAB_0013ebbd;
      }
      pVar3 = ppVar21[5];
      if (pVar3 != (plutovg_paint_t)0x0) {
        local_1028 = ppVar21[4];
        local_1038._0_8_ = ppVar21[2];
        unique0x10001863 = ppVar21[3];
        local_1020 = *(long *)((long)pVar3 + 0x10);
        local_1018 = *(undefined8 *)((long)pVar3 + 4);
        local_1010 = *(int *)((long)pVar3 + 0xc);
        lVar15 = lroundf(ppVar2->opacity * (float)ppVar21[1].type * 256.0);
        local_100c = (int)lVar15;
        plutovg_matrix_multiply
                  ((plutovg_matrix_t *)local_1038,(plutovg_matrix_t *)local_1038,&ppVar2->matrix);
        _Var7 = plutovg_matrix_invert((plutovg_matrix_t *)local_1038,(plutovg_matrix_t *)local_1038)
        ;
        if (_Var7) {
          fVar36 = (float)local_1038._0_8_;
          fVar38 = SUB84(local_1038._0_8_,4);
          uVar8 = (uint)local_1018;
          uVar22 = local_1018._4_4_;
          if (((fVar36 == 1.0) && (!NAN(fVar36))) && (fVar38 == 0.0)) {
            if (((float)local_1038._8_4_ == 0.0) && (!NAN((float)local_1038._8_4_))) {
              if ((fStack_102c == 1.0) && (!NAN(fStack_102c))) {
                iVar30 = (span_buffer->spans).size;
                p_Var4 = composition_table[ppVar2->op];
                iVar23 = (int)(float)local_1028.ref_count;
                if (ppVar21[1].ref_count == 0) {
                  if (iVar30 == 0) {
                    return;
                  }
                  iVar16 = (int)(float)local_1028.type;
                  ppVar24 = (span_buffer->spans).data;
                  ppVar5 = canvas->surface;
                  do {
                    lVar15 = (long)ppVar24->y + (long)iVar16;
                    iVar27 = (int)lVar15;
                    if ((-1 < iVar27) && (iVar27 < (int)uVar22)) {
                      uVar9 = ppVar24->x + iVar23;
                      if ((int)uVar9 < (int)uVar8) {
                        uVar26 = 0;
                        if (0 < (int)uVar9) {
                          uVar26 = (ulong)uVar9;
                        }
                        uVar10 = 0;
                        if ((int)uVar9 < 0) {
                          uVar10 = uVar9;
                        }
                        iVar17 = uVar10 + ppVar24->len;
                        iVar27 = uVar8 - (int)uVar26;
                        if (iVar17 + (int)uVar26 <= (int)uVar8) {
                          iVar27 = iVar17;
                        }
                        if (0 < iVar27) {
                          iVar17 = ppVar24->x;
                          if ((int)uVar9 < 0) {
                            iVar17 = -iVar23;
                          }
                          (*p_Var4)((uint32_t *)
                                    (ppVar5->data +
                                    (long)iVar17 * 4 + (long)ppVar5->stride * (long)ppVar24->y),
                                    iVar27,(uint32_t *)
                                           (local_1010 * lVar15 + local_1020 + uVar26 * 4),
                                    (int)((uint)ppVar24->coverage * local_100c) >> 8);
                        }
                      }
                    }
                    iVar30 = iVar30 + -1;
                    ppVar24 = ppVar24 + 1;
                  } while (iVar30 != 0);
                  return;
                }
                iVar23 = iVar23 % (int)(uint)local_1018;
                iVar16 = (int)(float)local_1028.type % (int)local_1018._4_4_;
                if (iVar30 == 0) {
                  return;
                }
                uVar9 = iVar23 >> 0x1f & (uint)local_1018;
                uVar10 = iVar16 >> 0x1f & local_1018._4_4_;
                local_2158 = (span_buffer->spans).data;
                ppVar5 = canvas->surface;
                do {
                  iVar27 = local_2158->len;
                  iVar17 = (int)(local_2158->y + uVar10 + iVar16) % (int)uVar22;
                  if (iVar27 != 0) {
                    iVar18 = (uint)local_2158->coverage * local_100c;
                    iVar29 = local_2158->x;
                    iVar19 = (int)(uVar9 + iVar23 + iVar29) % (int)uVar8;
                    iVar19 = (iVar19 >> 0x1f & uVar8) + iVar19;
                    do {
                      iVar20 = uVar8 - iVar19;
                      if (iVar27 <= (int)(uVar8 - iVar19)) {
                        iVar20 = iVar27;
                      }
                      if (0x3ff < iVar20) {
                        iVar20 = 0x400;
                      }
                      (*p_Var4)((uint32_t *)
                                (ppVar5->data +
                                (long)iVar29 * 4 + (long)ppVar5->stride * (long)local_2158->y),
                                iVar20,(uint32_t *)
                                       ((long)local_1010 *
                                        (long)(int)((iVar17 >> 0x1f & uVar22) + iVar17) + local_1020
                                       + (long)iVar19 * 4),iVar18 >> 8);
                      iVar29 = iVar29 + iVar20;
                      iVar19 = iVar19 + iVar20;
                      if ((int)uVar8 <= iVar19) {
                        iVar19 = 0;
                      }
                      iVar27 = iVar27 - iVar20;
                    } while (iVar27 != 0);
                  }
                  iVar30 = iVar30 + -1;
                  local_2158 = local_2158 + 1;
                } while (iVar30 != 0);
                return;
              }
            }
          }
          ppVar5 = canvas->surface;
          ppVar24 = (span_buffer->spans).data;
          iVar30 = (span_buffer->spans).size;
          p_Var4 = composition_table[ppVar2->op];
          if (ppVar21[1].ref_count == 0) {
            if (iVar30 != 0) {
              do {
                iVar23 = ppVar24->len;
                if (iVar23 != 0) {
                  iVar16 = (uint)ppVar24->coverage * local_100c;
                  fVar34 = (float)ppVar24->y + 0.5;
                  fVar40 = (float)ppVar24->x + 0.5;
                  iVar27 = (int)((fVar34 * (float)local_1038._8_4_ +
                                  fVar40 * (float)local_1038._0_4_ + (float)local_1028.ref_count) *
                                65536.0);
                  iVar17 = (int)((fVar34 * (float)local_1038._12_4_ +
                                  fVar40 * (float)local_1038._4_4_ + (float)local_1028.type) *
                                65536.0);
                  puVar32 = (uint32_t *)
                            (ppVar5->data +
                            (long)ppVar24->x * 4 + (long)ppVar5->stride * (long)ppVar24->y);
                  do {
                    iVar29 = 0x400;
                    if (iVar23 < 0x400) {
                      iVar29 = iVar23;
                    }
                    if (0 < iVar23) {
                      ppVar21 = (plutovg_paint_t *)local_2078;
                      do {
                        uVar9 = iVar27 >> 0x10;
                        iVar18 = iVar17 >> 0x10;
                        uVar25 = 0;
                        if (-1 < (int)uVar9) {
                          auVar41._0_4_ = -(uint)((int)uVar9 < (int)uVar8);
                          auVar41._4_4_ = auVar41._0_4_;
                          auVar41._8_4_ = -(uint)(iVar18 < (int)uVar22);
                          auVar41._12_4_ = -(uint)(iVar18 < (int)uVar22);
                          uVar10 = movmskpd((int)in_R10,auVar41);
                          in_R10 = (ulong)uVar10;
                          if ((byte)(-1 < iVar18 & (byte)uVar10 & (byte)uVar10 >> 1) == 1) {
                            uVar25 = *(uint32_t *)
                                      ((long)iVar18 * (long)local_1010 + local_1020 +
                                      (ulong)uVar9 * 4);
                          }
                        }
                        ppVar21->ref_count = uVar25;
                        iVar27 = iVar27 + (int)(fVar36 * 65536.0);
                        iVar17 = iVar17 + (int)(fVar38 * 65536.0);
                        ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                      } while (ppVar21 < (uint32_t *)
                                         ((long)&((plutovg_paint_t *)local_2078)->ref_count +
                                         (long)iVar29 * 4));
                    }
                    (*p_Var4)(puVar32,iVar29,(uint32_t *)local_2078,iVar16 >> 8);
                    puVar32 = puVar32 + iVar29;
                    iVar23 = iVar23 - iVar29;
                  } while (iVar23 != 0);
                }
                iVar30 = iVar30 + -1;
                ppVar24 = ppVar24 + 1;
              } while (iVar30 != 0);
            }
          }
          else {
            iVar23 = local_1010 + 3;
            if (-1 < local_1010) {
              iVar23 = local_1010;
            }
            if (iVar30 != 0) {
              do {
                lVar15 = local_1020;
                iVar16 = ppVar24->len;
                if (iVar16 != 0) {
                  iVar27 = (uint)ppVar24->coverage * local_100c;
                  fVar34 = (float)ppVar24->y + 0.5;
                  fVar40 = (float)ppVar24->x + 0.5;
                  iVar17 = (int)((fVar34 * (float)local_1038._8_4_ +
                                  fVar40 * (float)local_1038._0_8_ + (float)local_1028.ref_count) *
                                65536.0);
                  iVar29 = (int)((fVar34 * fStack_102c + fVar40 * SUB84(local_1038._0_8_,4) +
                                 (float)local_1028.type) * 65536.0);
                  puVar32 = (uint32_t *)
                            (ppVar5->data +
                            (long)ppVar24->x * 4 + (long)ppVar5->stride * (long)ppVar24->y);
                  do {
                    iVar18 = 0x400;
                    if (iVar16 < 0x400) {
                      iVar18 = iVar16;
                    }
                    if (0 < iVar16) {
                      ppVar21 = (plutovg_paint_t *)local_2078;
                      do {
                        iVar19 = (iVar17 >> 0x10) % (int)uVar8;
                        iVar20 = (iVar29 >> 0x10) % (int)uVar22;
                        iVar19 = (iVar19 >> 0x1f & uVar8) + iVar19;
                        if ((iVar19 < 0) || ((int)uVar8 <= iVar19)) {
                          __assert_fail("px >= 0 && px < image_width",
                                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-blend.c"
                                        ,0x37e,
                                        "void blend_transformed_tiled_argb(plutovg_surface_t *, plutovg_operator_t, const texture_data_t *, const plutovg_span_buffer_t *)"
                                       );
                        }
                        iVar20 = (iVar20 >> 0x1f & uVar22) + iVar20;
                        if ((iVar20 < 0) || ((int)uVar22 <= iVar20)) {
                          __assert_fail("py >= 0 && py < image_height",
                                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-blend.c"
                                        ,0x37f,
                                        "void blend_transformed_tiled_argb(plutovg_surface_t *, plutovg_operator_t, const texture_data_t *, const plutovg_span_buffer_t *)"
                                       );
                        }
                        ppVar21->ref_count =
                             *(undefined4 *)(lVar15 + (long)(iVar20 * (iVar23 >> 2) + iVar19) * 4);
                        iVar17 = iVar17 + (int)(fVar36 * 65536.0);
                        iVar29 = iVar29 + (int)(fVar38 * 65536.0);
                        ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                      } while (ppVar21 < (undefined4 *)
                                         ((long)&((plutovg_paint_t *)local_2078)->ref_count +
                                         (long)iVar18 * 4));
                    }
                    (*p_Var4)(puVar32,iVar18,(uint32_t *)local_2078,iVar27 >> 8);
                    puVar32 = puVar32 + iVar18;
                    iVar16 = iVar16 - iVar18;
                  } while (iVar16 != 0);
                }
                iVar30 = iVar30 + -1;
                ppVar24 = ppVar24 + 1;
              } while (iVar30 != 0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void plutovg_blend(plutovg_canvas_t* canvas, const plutovg_span_buffer_t* span_buffer)
{
    if(span_buffer->spans.size == 0)
        return;
    if(canvas->state->paint == NULL) {
        plutovg_blend_color(canvas, &canvas->state->color, span_buffer);
        return;
    }

    plutovg_paint_t* paint = canvas->state->paint;
    if(paint->type == PLUTOVG_PAINT_TYPE_COLOR) {
        plutovg_solid_paint_t* solid = (plutovg_solid_paint_t*)(paint);
        plutovg_blend_color(canvas, &solid->color, span_buffer);
    } else if(paint->type == PLUTOVG_PAINT_TYPE_GRADIENT) {
        plutovg_gradient_paint_t* gradient = (plutovg_gradient_paint_t*)(paint);
        plutovg_blend_gradient(canvas, gradient, span_buffer);
    } else {
        plutovg_texture_paint_t* texture = (plutovg_texture_paint_t*)(paint);
        plutovg_blend_texture(canvas, texture, span_buffer);
    }
}